

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bufq.c
# Opt level: O0

void Curl_bufq_reset(bufq *q)

{
  buf_chunk *pbVar1;
  buf_chunk *chunk;
  bufq *q_local;
  
  while (q->head != (buf_chunk *)0x0) {
    pbVar1 = q->head;
    q->head = pbVar1->next;
    pbVar1->next = q->spare;
    q->spare = pbVar1;
  }
  q->tail = (buf_chunk *)0x0;
  return;
}

Assistant:

void Curl_bufq_reset(struct bufq *q)
{
  struct buf_chunk *chunk;
  while(q->head) {
    chunk = q->head;
    q->head = chunk->next;
    chunk->next = q->spare;
    q->spare = chunk;
  }
  q->tail = NULL;
}